

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O0

void __thiscall
google::protobuf::strings::GrowingArrayByteSink::ShrinkToFit(GrowingArrayByteSink *this)

{
  char *__dest;
  char *just_enough;
  GrowingArrayByteSink *this_local;
  
  if ((0x100 < this->capacity_) && (this->size_ < this->capacity_ * 3 >> 2)) {
    __dest = (char *)operator_new__(this->size_);
    memcpy(__dest,this->buf_,this->size_);
    if (this->buf_ != (char *)0x0) {
      operator_delete__(this->buf_);
    }
    this->buf_ = __dest;
    this->capacity_ = this->size_;
  }
  return;
}

Assistant:

void GrowingArrayByteSink::ShrinkToFit() {
  // Shrink only if the buffer is large and size_ is less than 3/4
  // of capacity_.
  if (capacity_ > 256 && size_ < (3 * capacity_) / 4) {
    char* just_enough = new char[size_];
    memcpy(just_enough, buf_, size_);
    delete[] buf_;
    buf_ = just_enough;
    capacity_ = size_;
  }
}